

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O0

char * kind_name(short kind)

{
  char *pcStack_10;
  short kind_local;
  
  if (kind == 0) {
    pcStack_10 = "level";
  }
  else if (kind == 1) {
    pcStack_10 = "global";
  }
  else if (kind == 2) {
    pcStack_10 = "object";
  }
  else {
    pcStack_10 = "unknown";
  }
  return pcStack_10;
}

Assistant:

static const char *kind_name(short kind)
{
    switch (kind) {
	case TIMER_LEVEL: return "level";
	case TIMER_GLOBAL: return "global";
	case TIMER_OBJECT: return "object";
    }
    return "unknown";
}